

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O0

Direction __thiscall
spvtools::opt::LoopPeelingPass::LoopPeelingInfo::GetPeelingInfo
          (LoopPeelingInfo *this,BasicBlock *bb)

{
  ScalarEvolutionAnalysis *pSVar1;
  SExpression lhs_00;
  SExpression rhs_00;
  SExpression lhs_01;
  bool bVar2;
  byte bVar3;
  Op OVar4;
  uint32_t uVar5;
  int iVar6;
  Instruction *pIVar7;
  Direction DVar8;
  DefUseManager *this_00;
  Instruction *pIVar9;
  SENode *pSVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Loop *pLVar11;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  byte bVar12;
  CmpOperator local_58;
  CmpOperator cmp_operator;
  bool is_rhs_rec;
  bool is_lhs_rec;
  SExpression rhs;
  SExpression lhs;
  Instruction *condition;
  DefUseManager *def_use_mgr;
  BasicBlock *bb_local;
  LoopPeelingInfo *this_local;
  
  pIVar7 = BasicBlock::terminator(bb);
  OVar4 = Instruction::opcode(pIVar7);
  if (OVar4 != OpBranchConditional) {
    DVar8 = GetNoneDirection();
    return DVar8;
  }
  this_00 = IRContext::get_def_use_mgr(this->context_);
  pIVar7 = BasicBlock::terminator(bb);
  uVar5 = Instruction::GetSingleWordInOperand(pIVar7,0);
  pIVar7 = analysis::DefUseManager::GetDef(this_00,uVar5);
  OVar4 = Instruction::opcode(pIVar7);
  bVar2 = IsHandledCondition(OVar4);
  if (!bVar2) {
    DVar8 = GetNoneDirection();
    return DVar8;
  }
  uVar5 = GetFirstLoopInvariantOperand(this,pIVar7);
  if (uVar5 == 0) {
    DVar8 = GetNoneDirection();
    return DVar8;
  }
  uVar5 = GetFirstNonLoopInvariantOperand(this,pIVar7);
  if (uVar5 == 0) {
    DVar8 = GetNoneDirection();
    return DVar8;
  }
  pSVar1 = this->scev_analysis_;
  uVar5 = Instruction::GetSingleWordInOperand(pIVar7,0);
  pIVar9 = analysis::DefUseManager::GetDef(this_00,uVar5);
  pSVar10 = ScalarEvolutionAnalysis::AnalyzeInstruction(pSVar1,pIVar9);
  SExpression::SExpression((SExpression *)&rhs.scev_,pSVar10);
  pSVar10 = SExpression::operator->((SExpression *)&rhs.scev_);
  iVar6 = (**pSVar10->_vptr_SENode)();
  if (iVar6 == 6) {
    DVar8 = GetNoneDirection();
    return DVar8;
  }
  pSVar1 = this->scev_analysis_;
  uVar5 = Instruction::GetSingleWordInOperand(pIVar7,1);
  pIVar9 = analysis::DefUseManager::GetDef(this_00,uVar5);
  pSVar10 = ScalarEvolutionAnalysis::AnalyzeInstruction(pSVar1,pIVar9);
  SExpression::SExpression((SExpression *)&cmp_operator,pSVar10);
  pSVar10 = SExpression::operator->((SExpression *)&cmp_operator);
  iVar6 = (**pSVar10->_vptr_SENode)();
  if (iVar6 == 6) {
    DVar8 = GetNoneDirection();
    return DVar8;
  }
  pSVar1 = this->scev_analysis_;
  pLVar11 = this->loop_;
  pSVar10 = SExpression::operator_cast_to_SENode_((SExpression *)&rhs.scev_);
  bVar2 = ScalarEvolutionAnalysis::IsLoopInvariant(pSVar1,pLVar11,pSVar10);
  bVar12 = (bVar2 ^ 0xffU) & 1;
  pSVar1 = this->scev_analysis_;
  pLVar11 = this->loop_;
  pSVar10 = SExpression::operator_cast_to_SENode_((SExpression *)&cmp_operator);
  bVar2 = ScalarEvolutionAnalysis::IsLoopInvariant(pSVar1,pLVar11,pSVar10);
  bVar3 = (bVar2 ^ 0xffU) & 1;
  if (((bVar12 != 0) && (bVar3 != 0)) || ((bVar12 == 0 && (bVar3 == 0)))) {
    DVar8 = GetNoneDirection();
    return DVar8;
  }
  if (bVar12 != 0) {
    pSVar10 = SExpression::operator->((SExpression *)&rhs.scev_);
    iVar6 = (*pSVar10->_vptr_SENode[6])();
    if (CONCAT44(extraout_var,iVar6) == 0) {
LAB_00403d31:
      DVar8 = GetNoneDirection();
      return DVar8;
    }
    pSVar10 = SExpression::operator->((SExpression *)&rhs.scev_);
    iVar6 = (*pSVar10->_vptr_SENode[6])();
    pLVar11 = SERecurrentNode::GetLoop((SERecurrentNode *)CONCAT44(extraout_var_00,iVar6));
    if (pLVar11 != this->loop_) goto LAB_00403d31;
  }
  if (bVar3 == 0) {
LAB_00403d96:
    OVar4 = Instruction::opcode(pIVar7);
    switch(OVar4) {
    case OpIEqual:
    case OpINotEqual:
      lhs_01.scev_ = (ScalarEvolutionAnalysis *)lhs.node_;
      lhs_01.node_ = (SENode *)rhs.scev_;
      rhs_00.scev_ = (ScalarEvolutionAnalysis *)rhs.node_;
      rhs_00.node_ = _cmp_operator;
      DVar8 = HandleEquality(this,lhs_01,rhs_00);
      return DVar8;
    case OpUGreaterThan:
    case OpSGreaterThan:
      local_58 = kGT;
      break;
    case OpUGreaterThanEqual:
    case OpSGreaterThanEqual:
      local_58 = kGE;
      break;
    case OpULessThan:
    case OpSLessThan:
      local_58 = kLT;
      break;
    case OpULessThanEqual:
    case OpSLessThanEqual:
      local_58 = kLE;
      break;
    default:
      DVar8 = GetNoneDirection();
      return DVar8;
    }
    if (bVar12 != 0) {
      std::swap<spvtools::opt::SExpression>((SExpression *)&rhs.scev_,(SExpression *)&cmp_operator);
      switch(local_58) {
      case kLT:
        local_58 = kGT;
        break;
      case kGT:
        local_58 = kLT;
        break;
      case kLE:
        local_58 = kGE;
        break;
      case kGE:
        local_58 = kLE;
      }
    }
    pSVar10 = SExpression::operator->((SExpression *)&cmp_operator);
    iVar6 = (*pSVar10->_vptr_SENode[6])();
    lhs_00.scev_ = (ScalarEvolutionAnalysis *)lhs.node_;
    lhs_00.node_ = (SENode *)rhs.scev_;
    DVar8 = HandleInequality(this,local_58,lhs_00,(SERecurrentNode *)CONCAT44(extraout_var_03,iVar6)
                            );
    return DVar8;
  }
  pSVar10 = SExpression::operator->((SExpression *)&cmp_operator);
  iVar6 = (*pSVar10->_vptr_SENode[6])();
  if (CONCAT44(extraout_var_01,iVar6) != 0) {
    pSVar10 = SExpression::operator->((SExpression *)&cmp_operator);
    iVar6 = (*pSVar10->_vptr_SENode[6])();
    pLVar11 = SERecurrentNode::GetLoop((SERecurrentNode *)CONCAT44(extraout_var_02,iVar6));
    if (pLVar11 == this->loop_) goto LAB_00403d96;
  }
  DVar8 = GetNoneDirection();
  return DVar8;
}

Assistant:

LoopPeelingPass::LoopPeelingInfo::Direction
LoopPeelingPass::LoopPeelingInfo::GetPeelingInfo(BasicBlock* bb) const {
  if (bb->terminator()->opcode() != spv::Op::OpBranchConditional) {
    return GetNoneDirection();
  }

  analysis::DefUseManager* def_use_mgr = context_->get_def_use_mgr();

  Instruction* condition =
      def_use_mgr->GetDef(bb->terminator()->GetSingleWordInOperand(0));

  if (!IsHandledCondition(condition->opcode())) {
    return GetNoneDirection();
  }

  if (!GetFirstLoopInvariantOperand(condition)) {
    // No loop invariant, it cannot be peeled by this pass.
    return GetNoneDirection();
  }
  if (!GetFirstNonLoopInvariantOperand(condition)) {
    // Seems to be a job for the unswitch pass.
    return GetNoneDirection();
  }

  // Left hand-side.
  SExpression lhs = scev_analysis_->AnalyzeInstruction(
      def_use_mgr->GetDef(condition->GetSingleWordInOperand(0)));
  if (lhs->GetType() == SENode::CanNotCompute) {
    // Can't make any conclusion.
    return GetNoneDirection();
  }

  // Right hand-side.
  SExpression rhs = scev_analysis_->AnalyzeInstruction(
      def_use_mgr->GetDef(condition->GetSingleWordInOperand(1)));
  if (rhs->GetType() == SENode::CanNotCompute) {
    // Can't make any conclusion.
    return GetNoneDirection();
  }

  // Only take into account recurrent expression over the current loop.
  bool is_lhs_rec = !scev_analysis_->IsLoopInvariant(loop_, lhs);
  bool is_rhs_rec = !scev_analysis_->IsLoopInvariant(loop_, rhs);

  if ((is_lhs_rec && is_rhs_rec) || (!is_lhs_rec && !is_rhs_rec)) {
    return GetNoneDirection();
  }

  if (is_lhs_rec) {
    if (!lhs->AsSERecurrentNode() ||
        lhs->AsSERecurrentNode()->GetLoop() != loop_) {
      return GetNoneDirection();
    }
  }
  if (is_rhs_rec) {
    if (!rhs->AsSERecurrentNode() ||
        rhs->AsSERecurrentNode()->GetLoop() != loop_) {
      return GetNoneDirection();
    }
  }

  // If the op code is ==, then we try a peel before or after.
  // If opcode is not <, >, <= or >=, we bail out.
  //
  // For the remaining cases, we canonicalize the expression so that the
  // constant expression is on the left hand side and the recurring expression
  // is on the right hand side. If we swap hand side, then < becomes >, <=
  // becomes >= etc.
  // If the opcode is <=, then we add 1 to the right hand side and do the peel
  // check on <.
  // If the opcode is >=, then we add 1 to the left hand side and do the peel
  // check on >.

  CmpOperator cmp_operator;
  switch (condition->opcode()) {
    default:
      return GetNoneDirection();
    case spv::Op::OpIEqual:
    case spv::Op::OpINotEqual:
      return HandleEquality(lhs, rhs);
    case spv::Op::OpUGreaterThan:
    case spv::Op::OpSGreaterThan: {
      cmp_operator = CmpOperator::kGT;
      break;
    }
    case spv::Op::OpULessThan:
    case spv::Op::OpSLessThan: {
      cmp_operator = CmpOperator::kLT;
      break;
    }
    // We add one to transform >= into > and <= into <.
    case spv::Op::OpUGreaterThanEqual:
    case spv::Op::OpSGreaterThanEqual: {
      cmp_operator = CmpOperator::kGE;
      break;
    }
    case spv::Op::OpULessThanEqual:
    case spv::Op::OpSLessThanEqual: {
      cmp_operator = CmpOperator::kLE;
      break;
    }
  }

  // Force the left hand side to be the non recurring expression.
  if (is_lhs_rec) {
    std::swap(lhs, rhs);
    switch (cmp_operator) {
      case CmpOperator::kLT: {
        cmp_operator = CmpOperator::kGT;
        break;
      }
      case CmpOperator::kGT: {
        cmp_operator = CmpOperator::kLT;
        break;
      }
      case CmpOperator::kLE: {
        cmp_operator = CmpOperator::kGE;
        break;
      }
      case CmpOperator::kGE: {
        cmp_operator = CmpOperator::kLE;
        break;
      }
    }
  }
  return HandleInequality(cmp_operator, lhs, rhs->AsSERecurrentNode());
}